

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char * __thiscall
fmt::v7::detail::
format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
::on_format_specs(format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                  *this,int id,char *begin,char *end)

{
  basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *this_00;
  size_t *psVar1;
  undefined1 value [16];
  undefined1 value_00 [16];
  handle handle;
  basic_string_view<char> value_01;
  char *pcVar2;
  format_arg arg;
  unkbyte10 in_stack_ffffffffffffff68;
  undefined6 in_stack_ffffffffffffff72;
  format_specs local_88;
  float local_78;
  undefined4 uStack_74;
  undefined2 uStack_70;
  undefined6 uStack_6e;
  int local_68;
  arg_formatter<fmt::v7::detail::buffer_appender<char>,_char> local_58;
  
  this_00 = &this->context;
  get_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>,int>
            ((format_arg *)(&local_88 + 1),(detail *)this_00,
             (basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *)(ulong)(uint)id,
             (int)end);
  if (local_68 == 0xf) {
    pcVar2 = (this->parse_context).format_str_.data_;
    (this->parse_context).format_str_.data_ = begin;
    psVar1 = &(this->parse_context).format_str_.size_;
    *psVar1 = (size_t)(pcVar2 + (*psVar1 - (long)begin));
    (*(code *)CONCAT62(uStack_6e,uStack_70))
              (CONCAT44(uStack_74,local_78),&this->parse_context,this_00);
    pcVar2 = (this->parse_context).format_str_.data_;
  }
  else {
    local_88.width = 0;
    local_88.precision = -1;
    local_88.type = '\0';
    local_88._9_1_ = 0;
    local_88.fill.data_[0] = ' ';
    local_88.fill.data_[1] = '\0';
    local_88.fill.data_[2] = '\0';
    local_88.fill.data_[3] = '\0';
    local_88.fill.size_ = '\x01';
    pcVar2 = begin + 1;
    if (((pcVar2 < end) && (*pcVar2 == '}')) && ((byte)((*begin & 0xdfU) + 0xbf) < 0x1a)) {
      local_88._9_3_ = 0x2000;
      local_88.type = *begin;
    }
    else {
      local_58.
      super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
      .locale_.locale_ = &this->parse_context;
      local_58.
      super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
      .out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
           (back_insert_iterator<fmt::v7::detail::buffer<char>_>)&local_88;
      local_58.ctx_ = (context_type *)&local_58;
      local_58.parse_ctx_ =
           (basic_format_parse_context<char,_fmt::v7::detail::error_handler> *)
           CONCAT44(local_58.parse_ctx_._4_4_,local_68);
      local_58.
      super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
      .specs_ = (format_specs *)this_00;
      pcVar2 = parse_format_specs<char,fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>>&>
                         (begin,end,
                          (specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_>
                           *)local_58.ctx_);
      if ((pcVar2 == end) || (*pcVar2 != '}')) {
        error_handler::on_error((error_handler *)begin,"missing \'}\' in format string");
      }
    }
    local_58.parse_ctx_ = &this->parse_context;
    local_58.
    super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
    .out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
         (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
         (this->context).out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
    local_58.
    super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
    .locale_.locale_ = (this->context).loc_.locale_;
    local_58.
    super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
    .specs_ = &local_88;
    local_58.ptr_ = (char *)0x0;
    local_58.ctx_ = this_00;
    switch(local_68) {
    case 1:
      arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
      ::write_int<int>(&local_58.
                        super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                       ,(int)local_78,&local_88);
      break;
    case 2:
      arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
      ::write_int<unsigned_int>
                (&local_58.
                  super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                 ,(uint)local_78,&local_88);
      break;
    case 3:
      arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
      ::write_int<long_long>
                (&local_58.
                  super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                 ,CONCAT44(uStack_74,local_78),&local_88);
      break;
    case 4:
      arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
      ::write_int<unsigned_long_long>
                (&local_58.
                  super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                 ,CONCAT44(uStack_74,local_78),&local_88);
      break;
    case 5:
      value._10_6_ = in_stack_ffffffffffffff72;
      value._0_10_ = in_stack_ffffffffffffff68;
      arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
      ::write_int<__int128>
                (&local_58.
                  super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                 ,(__int128)value,(format_specs *)CONCAT44(uStack_74,local_78));
      break;
    case 6:
      value_00._10_6_ = in_stack_ffffffffffffff72;
      value_00._0_10_ = in_stack_ffffffffffffff68;
      arg_formatter_base<fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::error_handler>
      ::write_int<unsigned__int128>
                ((arg_formatter_base<fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::error_handler>
                  *)&local_58,(unsigned___int128)value_00,
                 (format_specs *)CONCAT44(uStack_74,local_78));
      break;
    case 7:
      local_58.
      super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
      .out_ = arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
              ::operator()(&local_58.
                            super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                           ,local_78._0_1_);
      break;
    case 8:
      local_58.
      super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
      .out_ = arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
              ::operator()(&local_58.
                            super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                           ,local_78._0_1_);
      break;
    case 9:
      local_58.
      super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
      .out_ = arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
              ::operator()<float,_0>
                        (&local_58.
                          super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                         ,local_78);
      break;
    case 10:
      local_58.
      super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
      .out_ = arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
              ::operator()<double,_0>
                        (&local_58.
                          super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                         ,(double)CONCAT44(uStack_74,local_78));
      break;
    case 0xb:
      local_58.
      super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
      .out_ = arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
              ::operator()<long_double,_0>
                        (&local_58.
                          super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                         ,(longdouble)CONCAT28(uStack_70,CONCAT44(uStack_74,local_78)));
      break;
    case 0xc:
      local_58.
      super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
      .out_ = arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
              ::operator()(&local_58.
                            super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                           ,(char *)CONCAT44(uStack_74,local_78));
      break;
    case 0xd:
      value_01.data_._4_4_ = uStack_74;
      value_01.data_._0_4_ = local_78;
      value_01.size_._0_2_ = uStack_70;
      value_01.size_._2_6_ = uStack_6e;
      local_58.
      super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
      .out_ = arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
              ::operator()(&local_58.
                            super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                           ,value_01);
      break;
    case 0xe:
      local_58.
      super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
      .out_ = arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
              ::operator()(&local_58.
                            super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                           ,(void *)CONCAT44(uStack_74,local_78));
      break;
    case 0xf:
      handle.custom_.value._4_4_ = uStack_74;
      handle.custom_.value._0_4_ = local_78;
      handle.custom_.format._0_2_ = uStack_70;
      handle.custom_.format._2_6_ = uStack_6e;
      local_58.
      super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
      .out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
           (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
           arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>::operator()(&local_58,handle)
      ;
    }
    (this_00->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
         (buffer<char> *)
         local_58.
         super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
         .out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  }
  return pcVar2;
}

Assistant:

const Char* on_format_specs(int id, const Char* begin, const Char* end) {
    auto arg = get_arg(context, id);
    if (arg.type() == type::custom_type) {
      advance_to(parse_context, begin);
      visit_format_arg(custom_formatter<Context>(parse_context, context), arg);
      return parse_context.begin();
    }
    auto specs = basic_format_specs<Char>();
    if (begin + 1 < end && begin[1] == '}' && is_ascii_letter(*begin)) {
      specs.type = static_cast<char>(*begin++);
    } else {
      using parse_context_t = basic_format_parse_context<Char>;
      specs_checker<specs_handler<parse_context_t, Context>> handler(
          specs_handler<parse_context_t, Context>(specs, parse_context,
                                                  context),
          arg.type());
      begin = parse_format_specs(begin, end, handler);
      if (begin == end || *begin != '}')
        on_error("missing '}' in format string");
    }
    context.advance_to(visit_format_arg(
        arg_formatter<OutputIt, Char>(context, &parse_context, &specs), arg));
    return begin;
  }